

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O1

int hdr_init(int64_t lowest_discernible_value,int64_t highest_trackable_value,
            int significant_figures,hdr_histogram **result)

{
  int iVar1;
  int64_t *__ptr;
  hdr_histogram *phVar2;
  hdr_histogram_bucket_config cfg;
  hdr_histogram_bucket_config local_60;
  
  iVar1 = hdr_calculate_bucket_config
                    (lowest_discernible_value,highest_trackable_value,significant_figures,&local_60)
  ;
  if (iVar1 == 0) {
    __ptr = (int64_t *)calloc((long)local_60.counts_len,8);
    iVar1 = 0xc;
    if (__ptr != (int64_t *)0x0) {
      phVar2 = (hdr_histogram *)calloc(1,0x68);
      if (phVar2 == (hdr_histogram *)0x0) {
        free(__ptr);
      }
      else {
        phVar2->counts = __ptr;
        phVar2->lowest_discernible_value = local_60.lowest_discernible_value;
        phVar2->highest_trackable_value = local_60.highest_trackable_value;
        phVar2->unit_magnitude = (int32_t)local_60.unit_magnitude;
        phVar2->significant_figures = (int32_t)local_60.significant_figures;
        phVar2->sub_bucket_half_count_magnitude = local_60.sub_bucket_half_count_magnitude;
        phVar2->sub_bucket_half_count = local_60.sub_bucket_half_count;
        phVar2->sub_bucket_mask = local_60.sub_bucket_mask;
        phVar2->sub_bucket_count = local_60.sub_bucket_count;
        phVar2->min_value = 0x7fffffffffffffff;
        iVar1 = 0;
        phVar2->max_value = 0;
        phVar2->normalizing_index_offset = 0;
        phVar2->conversion_ratio = 1.0;
        phVar2->bucket_count = local_60.bucket_count;
        phVar2->counts_len = local_60.counts_len;
        phVar2->total_count = 0;
        *result = phVar2;
      }
    }
  }
  return iVar1;
}

Assistant:

int hdr_init(
    int64_t lowest_discernible_value,
    int64_t highest_trackable_value,
    int significant_figures,
    struct hdr_histogram** result)
{
    int64_t* counts;
    struct hdr_histogram_bucket_config cfg;
    struct hdr_histogram* histogram;

    int r = hdr_calculate_bucket_config(lowest_discernible_value, highest_trackable_value, significant_figures, &cfg);
    if (r)
    {
        return r;
    }

    counts = (int64_t*) hdr_calloc((size_t) cfg.counts_len, sizeof(int64_t));
    if (!counts)
    {
        return ENOMEM;
    }

    histogram = (struct hdr_histogram*) hdr_calloc(1, sizeof(struct hdr_histogram));
    if (!histogram)
    {
        hdr_free(counts);
        return ENOMEM;
    }

    histogram->counts = counts;

    hdr_init_preallocated(histogram, &cfg);
    *result = histogram;

    return 0;
}